

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void setup_doors(tgestate_t *state)

{
  room_t rVar1;
  doorindex_t *pdVar2;
  door_t *pdVar3;
  char cVar4;
  doorindex_t dVar5;
  doorindex_t dVar6;
  bool bVar7;
  
  pdVar2 = state->interior_doors;
  state->interior_doors[0] = 0xff;
  state->interior_doors[1] = 0xff;
  state->interior_doors[2] = 0xff;
  state->interior_doors[3] = 0xff;
  rVar1 = state->room_index;
  pdVar3 = doors;
  cVar4 = -0x7c;
  dVar5 = '\0';
  do {
    dVar6 = dVar5 + 0x80;
    if ((byte)(pdVar3->room_and_direction & 0xfc) == (byte)(rVar1 << 2)) {
      *pdVar2 = dVar6;
      pdVar2 = pdVar2 + 1;
    }
    bVar7 = -1 < (char)dVar5;
    dVar5 = dVar5 + 0x81;
    if (bVar7) {
      dVar5 = dVar6;
    }
    pdVar3 = pdVar3 + 1;
    cVar4 = cVar4 + '\x01';
  } while (cVar4 != '\0');
  return;
}

Assistant:

void setup_doors(tgestate_t *state)
{
  doorindex_t  *pdoorindex; /* was DE */
  uint8_t       iters;      /* was B */
  uint8_t       room;       /* was B */ // same type as door_t->room_and_flags
  doorindex_t   door_index; /* was C */
  const door_t *door;       /* was HL' */
  uint8_t       door_iters; /* was B' */

  assert(state != NULL);

  /* Wipe state->interior_doors[] with interiordoor_NONE.
   * Alternative: memset(&state->interior_doors[0], interiordoor_NONE, 4); */
  pdoorindex = &state->interior_doors[3];
  iters = 4;
  do
    *pdoorindex-- = interiordoor_NONE;
  while (--iters);

  pdoorindex++; /* Reset to first byte of interior_doors[]. */
  ASSERT_DOORS_VALID(pdoorindex);

  /* Ensure that no flag bits remain. */
  assert(state->room_index < room__LIMIT);

  room       = state->room_index << 2; /* Shift left to match comparison in loop. */
  door_index = 0;
  door       = &doors[0];
  door_iters = NELEMS(doors); /* Iterate over every door in doors[]. */
  do
  {
    /* Save the door index (and current reverse flag) whenever we match the
     * current room. Rooms are always rectangular so should have no more than
     * four doors present but that is unchecked by this code. */
    if ((door->room_and_direction & ~door_FLAGS_MASK_DIRECTION) == room)
      *pdoorindex++ = door_index ^ door_REVERSE;

    /* On every iteration toggle the reverse flag. */
    door_index ^= door_REVERSE;

    /* Increment door_index once every two iterations. */
    if (door_index < door_REVERSE) /* Conv: was JP M. */
      door_index++;

    door++;
  }
  while (--door_iters);
}